

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_sched.cpp
# Opt level: O0

void __kmp_team_static_init<unsigned_long_long>
               (ident_t *loc,kmp_int32 gtid,kmp_int32 *p_last,unsigned_long_long *p_lb,
               unsigned_long_long *p_ub,signed_t_conflict *p_st,signed_t_conflict incr,
               signed_t_conflict chunk)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  ulong *in_RCX;
  ident_t *in_RDX;
  kmp_i18n_id_t in_ESI;
  ulong *in_R8;
  long *in_R9;
  ulong in_stack_00000008;
  kmp_info_t *th;
  kmp_team_t *team;
  ST span;
  unsigned_long_long upper;
  unsigned_long_long lower;
  UT trip_count;
  kmp_uint32 nteams;
  kmp_uint32 team_id;
  cons_type in_stack_fffffffffffffff0;
  
  uVar3 = *in_RCX;
  uVar4 = *in_R8;
  if (__kmp_env_consistency_check != 0) {
    if (in_stack_00000008 == 0) {
      __kmp_error_construct(in_ESI,in_stack_fffffffffffffff0,in_RDX);
    }
    if ((long)in_stack_00000008 < 1) {
      if (uVar4 <= uVar3) goto LAB_0019b3e1;
    }
    else if (uVar3 <= uVar4) goto LAB_0019b3e1;
    __kmp_error_construct(in_ESI,in_stack_fffffffffffffff0,in_RDX);
  }
LAB_0019b3e1:
  uVar1 = (__kmp_threads[(int)in_ESI]->th).th_teams_size.nteams;
  uVar2 = (((__kmp_threads[(int)in_ESI]->th).th_team)->t).t_master_tid;
  if (in_stack_00000008 == 1) {
    uVar5 = uVar4 - uVar3;
  }
  else if (in_stack_00000008 == 0xffffffffffffffff) {
    uVar5 = uVar3 - uVar4;
  }
  else if ((long)in_stack_00000008 < 1) {
    uVar5 = (uVar3 - uVar4) / -in_stack_00000008;
  }
  else {
    uVar5 = (uVar4 - uVar3) / in_stack_00000008;
  }
  if ((long)th < 1) {
    th = (kmp_info_t *)0x1;
  }
  lVar6 = (long)th * in_stack_00000008;
  *in_R9 = lVar6 * (ulong)uVar1;
  *in_RCX = uVar3 + lVar6 * (ulong)uVar2;
  *in_R8 = (*in_RCX + lVar6) - in_stack_00000008;
  if (in_RDX != (ident_t *)0x0) {
    in_RDX->reserved_1 = (uint)((ulong)uVar2 == (uVar5 / (ulong)th) % (ulong)uVar1);
  }
  if ((long)in_stack_00000008 < 1) {
    if (*in_RCX < *in_R8) {
      *in_R8 = 0;
    }
    if (*in_R8 < uVar4) {
      *in_R8 = uVar4;
    }
  }
  else {
    if (*in_R8 < *in_RCX) {
      *in_R8 = 0xffffffffffffffff;
    }
    if (uVar4 < *in_R8) {
      *in_R8 = uVar4;
    }
  }
  return;
}

Assistant:

static void __kmp_team_static_init(ident_t *loc, kmp_int32 gtid,
                                   kmp_int32 *p_last, T *p_lb, T *p_ub,
                                   typename traits_t<T>::signed_t *p_st,
                                   typename traits_t<T>::signed_t incr,
                                   typename traits_t<T>::signed_t chunk) {
  // The routine returns the first chunk distributed to the team and
  // stride for next chunks calculation.
  // Last iteration flag set for the team that will execute
  // the last iteration of the loop.
  // The routine is called for dist_schedue(static,chunk) only.
  typedef typename traits_t<T>::unsigned_t UT;
  typedef typename traits_t<T>::signed_t ST;
  kmp_uint32 team_id;
  kmp_uint32 nteams;
  UT trip_count;
  T lower;
  T upper;
  ST span;
  kmp_team_t *team;
  kmp_info_t *th;

  KMP_DEBUG_ASSERT(p_last && p_lb && p_ub && p_st);
  KE_TRACE(10, ("__kmp_team_static_init called (%d)\n", gtid));
#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff = __kmp_str_format("__kmp_team_static_init enter: T#%%d liter=%%d "
                            "iter=(%%%s, %%%s, %%%s) chunk %%%s; signed?<%s>\n",
                            traits_t<T>::spec, traits_t<T>::spec,
                            traits_t<ST>::spec, traits_t<ST>::spec,
                            traits_t<T>::spec);
    KD_TRACE(100, (buff, gtid, *p_last, *p_lb, *p_ub, *p_st, chunk));
    __kmp_str_free(&buff);
  }
#endif

  lower = *p_lb;
  upper = *p_ub;
  if (__kmp_env_consistency_check) {
    if (incr == 0) {
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrZeroProhibited, ct_pdo,
                            loc);
    }
    if (incr > 0 ? (upper < lower) : (lower < upper)) {
      // The loop is illegal.
      // Some zero-trip loops maintained by compiler, e.g.:
      //   for(i=10;i<0;++i) // lower >= upper - run-time check
      //   for(i=0;i>10;--i) // lower <= upper - run-time check
      //   for(i=0;i>10;++i) // incr > 0       - compile-time check
      //   for(i=10;i<0;--i) // incr < 0       - compile-time check
      // Compiler does not check the following illegal loops:
      //   for(i=0;i<10;i+=incr) // where incr<0
      //   for(i=10;i>0;i-=incr) // where incr<0
      __kmp_error_construct(kmp_i18n_msg_CnsLoopIncrIllegal, ct_pdo, loc);
    }
  }
  th = __kmp_threads[gtid];
  team = th->th.th_team;
#if OMP_40_ENABLED
  KMP_DEBUG_ASSERT(th->th.th_teams_microtask); // we are in the teams construct
  nteams = th->th.th_teams_size.nteams;
#endif
  team_id = team->t.t_master_tid;
  KMP_DEBUG_ASSERT(nteams == team->t.t_parent->t.t_nproc);

  // compute trip count
  if (incr == 1) {
    trip_count = upper - lower + 1;
  } else if (incr == -1) {
    trip_count = lower - upper + 1;
  } else if (incr > 0) {
    // upper-lower can exceed the limit of signed type
    trip_count = (UT)(upper - lower) / incr + 1;
  } else {
    trip_count = (UT)(lower - upper) / (-incr) + 1;
  }
  if (chunk < 1)
    chunk = 1;
  span = chunk * incr;
  *p_st = span * nteams;
  *p_lb = lower + (span * team_id);
  *p_ub = *p_lb + span - incr;
  if (p_last != NULL)
    *p_last = (team_id == ((trip_count - 1) / (UT)chunk) % nteams);
  // Correct upper bound if needed
  if (incr > 0) {
    if (*p_ub < *p_lb) // overflow?
      *p_ub = traits_t<T>::max_value;
    if (*p_ub > upper)
      *p_ub = upper; // tracker C73258
  } else { // incr < 0
    if (*p_ub > *p_lb)
      *p_ub = traits_t<T>::min_value;
    if (*p_ub < upper)
      *p_ub = upper; // tracker C73258
  }
#ifdef KMP_DEBUG
  {
    char *buff;
    // create format specifiers before the debug output
    buff =
        __kmp_str_format("__kmp_team_static_init exit: T#%%d team%%u liter=%%d "
                         "iter=(%%%s, %%%s, %%%s) chunk %%%s\n",
                         traits_t<T>::spec, traits_t<T>::spec,
                         traits_t<ST>::spec, traits_t<ST>::spec);
    KD_TRACE(100, (buff, gtid, team_id, *p_last, *p_lb, *p_ub, *p_st, chunk));
    __kmp_str_free(&buff);
  }
#endif
}